

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigRet.c
# Opt level: O2

int Rtm_ObjGetDegreeFwd(Rtm_Obj_t *pObj)

{
  uint uVar1;
  ulong uVar2;
  uint uVar3;
  
  uVar1 = 0;
  for (uVar2 = 0; (*(uint *)&pObj->field_0x8 >> 3 & 0xff0) != uVar2; uVar2 = uVar2 + 0x10) {
    uVar3 = *(uint *)(*(long *)((long)&pObj[1].pCopy + uVar2) + 8) >> 0xf;
    if (uVar1 <= uVar3) {
      uVar1 = uVar3;
    }
  }
  return uVar1 + 1;
}

Assistant:

int Rtm_ObjGetDegreeFwd( Rtm_Obj_t * pObj )
{
    Rtm_Obj_t * pFanin;
    int i, Degree = 0;
    Rtm_ObjForEachFanin( pObj, pFanin, i )
        Degree = Abc_MaxInt( Degree, (int)pFanin->Num );
    return Degree + 1;
}